

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch.hpp
# Opt level: O2

void boost::runtime::env::env_detail::
     fetch_absent<std::pair<boost::unit_test::basic_cstring<char_const>,bool>(*)(boost::unit_test::basic_cstring<char_const>)>
               (parameters_store *params,arguments_store *args,
               _func_pair<boost::unit_test::basic_cstring<const_char>,_bool>_basic_cstring<const_char>
               *read_func)

{
  bool bVar1;
  type pbVar2;
  _Base_ptr p_Var3;
  iterator extraout_RDX;
  basic_cstring<const_char> bVar4;
  basic_param_ptr param;
  pair<boost::unit_test::basic_cstring<const_char>,_bool> value;
  shared_ptr<boost::runtime::basic_param> local_180;
  _Rb_tree_node_base *local_170;
  pair<boost::unit_test::basic_cstring<const_char>,_bool> local_168;
  pointer local_148;
  pointer local_140;
  cstring local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined **local_110;
  pointer local_108;
  pointer local_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  format_error local_d8;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_a0;
  format_error local_68;
  
  local_170 = &(params->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar1 = true;
  for (p_Var3 = (params->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (bVar1 && (p_Var3 != local_170)); p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar1 = false;
    while (!bVar1) {
      local_180.px = (element_type *)p_Var3[1]._M_left;
      local_180.pn.pi_ = (sp_counted_base *)p_Var3[1]._M_right;
      if ((_Base_ptr)local_180.pn.pi_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_180.pn.pi_)->_M_parent =
             *(int *)&((_Base_ptr)local_180.pn.pi_)->_M_parent + 1;
        UNLOCK();
      }
      pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_180);
      local_138.m_begin = (pbVar2->p_name)._M_dataplus._M_p;
      local_138.m_end = local_138.m_begin + (pbVar2->p_name)._M_string_length;
      bVar1 = arguments_store::has(args,&local_138);
      if (!bVar1) {
        pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_180);
        if ((pbVar2->p_env_var)._M_string_length != 0) {
          pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_180);
          local_148 = (pbVar2->p_env_var)._M_dataplus._M_p;
          local_140 = local_148 + (pbVar2->p_env_var)._M_string_length;
          bVar4.m_end = extraout_RDX;
          bVar4.m_begin = (iterator)&local_148;
          (*read_func)(&local_168,bVar4);
          if (local_168.second != false) {
            if (CONCAT44(local_168.first.m_end._4_4_,local_168.first.m_end._0_4_) ==
                CONCAT44(local_168.first.m_begin._4_4_,local_168.first.m_begin._0_4_)) {
              pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_180);
              if ((pbVar2->p_has_optional_value).super_class_property<bool>.value == false) {
                pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_180);
                local_108 = (pbVar2->p_name)._M_dataplus._M_p;
                local_100 = local_108 + (pbVar2->p_name)._M_string_length;
                local_f8._M_p = (pointer)&local_e8;
                local_f0 = 0;
                local_e8._M_local_buf[0] = '\0';
                local_110 = &PTR__param_error_001e0f90;
                specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                operator<<(&local_d8,
                           (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                            *)&local_110,"Missing an argument value for the parameter ");
                pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_180);
                specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                operator<<((format_error *)&local_a0,
                           (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                            *)&local_d8,&pbVar2->p_name);
                specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                operator<<(&local_68,&local_a0," in the environment.");
                unit_test::ut_detail::throw_exception<boost::runtime::format_error>(&local_68);
              }
            }
            pbVar2 = shared_ptr<boost::runtime::basic_param>::operator->(&local_180);
            local_128 = local_168.first.m_begin._0_4_;
            uStack_124 = local_168.first.m_begin._4_4_;
            uStack_120 = local_168.first.m_end._0_4_;
            uStack_11c = local_168.first.m_end._4_4_;
            (*pbVar2->_vptr_basic_param[3])(pbVar2,&local_128,0,args);
          }
        }
      }
      detail::shared_count::~shared_count(&local_180.pn);
      bVar1 = true;
    }
  }
  return;
}

Assistant:

inline void
fetch_absent( parameters_store const& params, runtime::arguments_store& args, ReadFunc read_func )
{
    BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, params.all() ) {
        basic_param_ptr param = v.second;

        if( args.has( param->p_name ) || param->p_env_var.empty() )
            continue;

        std::pair<cstring,bool> value = read_func( param->p_env_var );

        if( !value.second )
            continue;

        // Validate against unexpected empty value
        BOOST_TEST_I_ASSRT( !value.first.is_empty() || param->p_has_optional_value,
            format_error( param->p_name ) 
                << "Missing an argument value for the parameter " << param->p_name
                << " in the environment." );

        // Produce argument value
        param->produce_argument( value.first, false, args );

    }
}